

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDDisplayParameters *
ON_SubDDisplayParameters::DecodeFromUnsignedChar
          (ON_SubDDisplayParameters *__return_storage_ptr__,uchar encoded_parameters)

{
  uchar compute_curvature;
  uchar location_ctrl_net;
  uchar density_as_char;
  uchar density_is_absolute;
  uchar encoded_parameters_local;
  
  memcpy(__return_storage_ptr__,&Default,0x40);
  if ((encoded_parameters & 0x80) != 0) {
    __return_storage_ptr__->m_bDisplayDensityIsAbsolute =
         (bool)(-((encoded_parameters & 0x10) != 0) & 1);
    __return_storage_ptr__->m_display_density = encoded_parameters & 7;
    if ((encoded_parameters & 8) != 0) {
      SetMeshLocation(__return_storage_ptr__,ControlNet);
    }
    SetComputeCurvature(__return_storage_ptr__,(encoded_parameters & 0x20) != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDDisplayParameters ON_SubDDisplayParameters::DecodeFromUnsignedChar(
  unsigned char encoded_parameters
)
{
  ON_SubDDisplayParameters p(ON_SubDDisplayParameters::Default);

  if (0 != (ON_SubDDisplayParameters::subd_mesh_nondefault_bit & encoded_parameters))
  {
    const unsigned char density_is_absolute = (ON_SubDDisplayParameters::subd_mesh_absolute_density_bit & encoded_parameters);
    const unsigned char density_as_char = (ON_SubDDisplayParameters::subd_mesh_density_mask & encoded_parameters);
    const unsigned char location_ctrl_net = (ON_SubDDisplayParameters::subd_mesh_location_bit & encoded_parameters);
    const unsigned char compute_curvature = (ON_SubDDisplayParameters::subd_mesh_compute_curvature_bit & encoded_parameters);
    p.m_bDisplayDensityIsAbsolute = (0 != density_is_absolute) ? true : false;
    p.m_display_density = density_as_char;
    if (0 != location_ctrl_net)
      p.SetMeshLocation(ON_SubDComponentLocation::ControlNet);
    p.SetComputeCurvature(0 != compute_curvature);
  }

  return p;
}